

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * luaH_get(Table *t,TValue *key)

{
  uint uVar1;
  int iVar2;
  lua_Integer in_RAX;
  TValue *pTVar3;
  lua_Integer k;
  lua_Integer local_18;
  
  uVar1 = key->tt_ & 0x3f;
  if (uVar1 == 0) {
    pTVar3 = &luaO_nilobject_;
  }
  else {
    if (uVar1 == 3) {
      local_18 = in_RAX;
      iVar2 = luaV_tointeger(key,&local_18,0);
      if (iVar2 != 0) {
        pTVar3 = luaH_getint(t,local_18);
        return pTVar3;
      }
    }
    else {
      if (uVar1 == 0x13) {
        pTVar3 = luaH_getint(t,(key->value_).i);
        return pTVar3;
      }
      if (uVar1 == 4) {
        pTVar3 = luaH_getshortstr(t,(TString *)(key->value_).gc);
        return pTVar3;
      }
    }
    pTVar3 = getgeneric(t,key);
  }
  return pTVar3;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VSHRSTR: return luaH_getshortstr(t, tsvalue(key));
    case LUA_VNUMINT: return luaH_getint(t, ivalue(key));
    case LUA_VNIL: return &absentkey;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      return getgeneric(t, key);
  }
}